

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall
Transaction_CommitTwoSeparateTransactions_Test::TestBody
          (Transaction_CommitTwoSeparateTransactions_Test *this)

{
  char *message;
  mock_mutex mutex;
  transaction<std::unique_lock<mock_mutex>_> t1;
  database db;
  unique_lock<mock_mutex> local_190;
  mutex_type local_179;
  transaction<std::unique_lock<mock_mutex>_> local_178;
  undefined1 local_140 [8];
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_138;
  vacuum_mode local_b8;
  
  pstore::database::database<pstore::file::in_memory>
            ((database *)local_140,&(this->super_Transaction).store_.file_,true);
  local_b8 = disabled;
  local_190._M_owns = false;
  local_190._M_device = &local_179;
  std::unique_lock<mock_mutex>::lock(&local_190);
  local_190._M_owns = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_178,(database *)local_140,&local_190);
  if ((local_190._M_owns == true) && (local_190._M_device != (mutex_type *)0x0)) {
    local_190._M_owns = false;
  }
  anon_unknown.dwarf_4168a5::append_int(&local_178,1);
  pstore::transaction_base::commit(&local_178.super_transaction_base);
  local_178.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00271290
  ;
  pstore::transaction_base::rollback(&local_178.super_transaction_base);
  if ((local_178.lock_._M_owns == true) && (local_178.lock_._M_device != (mutex_type *)0x0)) {
    local_178.lock_._M_owns = false;
  }
  local_190._M_owns = false;
  local_190._M_device = &local_179;
  std::unique_lock<mock_mutex>::lock(&local_190);
  local_190._M_owns = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_178,(database *)local_140,&local_190);
  if ((local_190._M_owns == true) && (local_190._M_device != (mutex_type *)0x0)) {
    local_190._M_owns = false;
  }
  anon_unknown.dwarf_4168a5::append_int(&local_178,2);
  pstore::transaction_base::commit(&local_178.super_transaction_base);
  local_178.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00271290
  ;
  pstore::transaction_base::rollback(&local_178.super_transaction_base);
  if ((local_178.lock_._M_owns == true) && (local_178.lock_._M_device != (mutex_type *)0x0)) {
    local_178.lock_._M_owns = false;
  }
  pstore::database::~database((database *)local_140);
  local_178.super_transaction_base._vptr_transaction_base = (_func_int **)0x130;
  local_190._M_device =
       *(mutex_type **)
        ((this->super_Transaction).store_.buffer_.
         super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28);
  testing::internal::
  CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
            ((internal *)local_140,"pstore::typed_address<pstore::trailer>::make (footer2)",
             "header->footer_pos.load ()",(typed_address<pstore::trailer> *)&local_178,
             (typed_address<pstore::trailer> *)&local_190);
  if (local_140[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_138._M_head_impl == (array<pstore::sat_entry,_65536UL> *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_138._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x1a4,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if (local_178.super_transaction_base._vptr_transaction_base != (_func_int **)0x0) {
      (**(code **)(*local_178.super_transaction_base._vptr_transaction_base + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       )local_138._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_138._M_head_impl);
  }
  return;
}

Assistant:

TEST_F (Transaction, CommitTwoSeparateTransactions) {
    // Append two individual transactions, each containing a single int.
    {
        pstore::database db{store_.file ()};
        db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        mock_mutex mutex;
        {
            auto t1 = begin (db, mock_lock (mutex));
            append_int (t1, 1);
            t1.commit ();
        }
        {
            auto t2 = begin (db, mock_lock (mutex));
            append_int (t2, 2);
            t2.commit ();
        }
    }

    std::size_t footer2 = pstore::leader_size;
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));
    footer2 += sizeof (pstore::trailer);

    footer2 += pstore::calc_alignment (footer2, alignof (int));
    footer2 += sizeof (int);
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));
    footer2 += sizeof (pstore::trailer);

    footer2 += pstore::calc_alignment (footer2, alignof (int));
    footer2 += sizeof (int);
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));

    pstore::header const * const header = this->get_header ();
    EXPECT_EQ (pstore::typed_address<pstore::trailer>::make (footer2), header->footer_pos.load ());
}